

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O3

void RandWalk(shared_ptr<MWakler> *walker)

{
  pointer *ppMVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  iterator __position;
  element_type *peVar8;
  float fVar9;
  float fVar10;
  Mrect r;
  Mrect local_38;
  
  peVar8 = (walker->super___shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __position._M_current =
       (peVar8->mRects).super__Vector_base<Mrect,_std::allocator<Mrect>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((peVar8->mRects).super__Vector_base<Mrect,_std::allocator<Mrect>_>._M_impl.
      super__Vector_impl_data._M_start == __position._M_current) {
    iVar6 = rand();
    iVar7 = rand();
    local_38.x1 = iVar6 % 100 + 10;
    local_38.y1 = iVar7 % 100 + 10;
    local_38.x2 = iVar6 % 100 + 0x32;
    local_38.y2 = iVar7 % 100 + 0x32;
    peVar8 = (walker->super___shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    __position._M_current =
         (peVar8->mRects).super__Vector_base<Mrect,_std::allocator<Mrect>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (peVar8->mRects).super__Vector_base<Mrect,_std::allocator<Mrect>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_00109f81;
  }
  else {
    uVar2 = __position._M_current[-1].x1;
    uVar3 = __position._M_current[-1].y1;
    uVar4 = __position._M_current[-1].x2;
    uVar5 = __position._M_current[-1].y2;
    fVar9 = (peVar8->mSpeed).sX;
    fVar10 = (peVar8->mSpeed).sY;
    local_38.x1 = (int)((float)(int)uVar2 + fVar9);
    local_38.y1 = (int)((float)(int)uVar3 + fVar10);
    local_38.x2 = (int)((float)(int)uVar4 + fVar9);
    local_38.y2 = (int)((float)(int)uVar5 + fVar10);
    if (__position._M_current ==
        (peVar8->mRects).super__Vector_base<Mrect,_std::allocator<Mrect>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
LAB_00109f81:
      std::vector<Mrect,std::allocator<Mrect>>::_M_realloc_insert<Mrect_const&>
                ((vector<Mrect,std::allocator<Mrect>> *)&peVar8->mRects,__position,&local_38);
      return;
    }
  }
  (__position._M_current)->x1 = local_38.x1;
  (__position._M_current)->y1 = local_38.y1;
  (__position._M_current)->x2 = local_38.x2;
  (__position._M_current)->y2 = local_38.y2;
  ppMVar1 = &(peVar8->mRects).super__Vector_base<Mrect,_std::allocator<Mrect>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppMVar1 = *ppMVar1 + 1;
  return;
}

Assistant:

inline void RandWalk(std::shared_ptr<MWakler> walker)
{
    if(walker->mRects.empty())
    {
        int randX = std::rand() % 100;
        int randY = std::rand() % 100;

        Mrect r{10 + randX,10 + randY,50 + randX,50 + randY};
        walker->mRects.push_back(r);
        return ;
    }

    Mrect r = walker->mRects.back();
    r.x1 += walker->mSpeed.sX;
    r.x2 += walker->mSpeed.sX;
    r.y1 += walker->mSpeed.sY;
    r.y2 += walker->mSpeed.sY;
    walker->mRects.push_back(r);
    return;
}